

Human: Reconstruct the original C/C++ source from this Ghidra decompilation:

# netaddress.cpp
# Opt level: O3

void __thiscall CService::CService(CService *this)

{
  long lVar1;
  CService *pCVar2;
  uint uVar3;
  long in_FS_OFFSET;
  
  lVar1 = *(long *)(in_FS_OFFSET + 0x28);
  (this->super_CNetAddr).m_addr._union.indirect_contents.indirect = (char *)0x0;
  *(undefined8 *)((long)&(this->super_CNetAddr).m_addr._union + 8) = 0;
  (this->super_CNetAddr).m_addr._size = 0;
  prevector<16U,_unsigned_char,_unsigned_int,_int>::change_capacity
            ((prevector<16U,_unsigned_char,_unsigned_int,_int> *)this,0x10);
  uVar3 = (this->super_CNetAddr).m_addr._size + 0x10;
  (this->super_CNetAddr).m_addr._size = uVar3;
  pCVar2 = this;
  if (0x10 < uVar3) {
    pCVar2 = (CService *)(this->super_CNetAddr).m_addr._union.indirect_contents.indirect;
  }
  (pCVar2->super_CNetAddr).m_addr._union.indirect_contents.indirect = (char *)0x0;
  *(undefined8 *)((long)&(pCVar2->super_CNetAddr).m_addr._union + 8) = 0;
  (this->super_CNetAddr).m_net = NET_IPV6;
  (this->super_CNetAddr).m_scope_id = 0;
  this->port = 0;
  if (*(long *)(in_FS_OFFSET + 0x28) == lVar1) {
    return;
  }
  __stack_chk_fail();
}

Assistant:

CService::CService() : port(0)
{
}